

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
* __thiscall
AlignmentRecord::referenceString
          (AlignmentRecord *this,vector<char,_std::allocator<char>_> *cigarData,int startPosition,
          string *sequence,string *qualities,string *reference)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  int in_ECX;
  vector<char,_std::allocator<char>_> *in_RDX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  *in_RDI;
  ulong in_R8;
  ulong in_R9;
  ulong in_stack_00000008;
  int s;
  string replaceString;
  int sequenceCounter;
  int referenceCounter;
  vector<int,_std::allocator<int>_> qualityList;
  string alignSeq;
  string constructedReference;
  value_type_conflict2 *in_stack_fffffffffffffc48;
  locale *this_00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  locale local_190 [8];
  undefined1 local_188 [52];
  int local_154;
  string local_150 [36];
  int local_12c;
  string local_128 [32];
  int local_108;
  int local_104;
  string local_100 [32];
  undefined4 local_e0;
  int local_dc;
  int local_d8;
  allocator local_d1;
  string local_d0 [32];
  int local_b0;
  int local_ac;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [40];
  ulong local_28;
  int local_1c;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x27ebfe);
  local_ac = computeOffset(in_stack_fffffffffffffc70);
  local_ac = local_1c - local_ac;
  local_b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"G",&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_d8 = 0;
  do {
    uVar1 = (ulong)local_d8;
    sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RDX);
    if (sVar2 <= uVar1) {
      Input = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::operator[](in_stack_00000008);
      std::__cxx11::string::operator+=(local_50,(char)Input->_M_dataplus);
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<char,_std::allocator<char>_>::size(in_RDX);
      std::__cxx11::string::size();
      __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
      std::locale::locale((locale *)__args_1);
      boost::algorithm::to_upper<std::__cxx11::string>(Input,(locale *)__args);
      std::locale::~locale((locale *)local_188);
      this_00 = local_190;
      std::locale::locale(this_00);
      boost::algorithm::to_upper<std::__cxx11::string>(Input,(locale *)__args);
      std::locale::~locale(local_190);
      std::
      make_tuple<std::__cxx11::string&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&>
                (__args,__args_1,(vector<int,_std::allocator<int>_> *)this_00);
      std::__cxx11::string::~string(local_d0);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)Input);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_50);
      return in_RDI;
    }
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(long)local_d8);
    if (*pvVar3 == 'I') {
      pcVar4 = (char *)std::__cxx11::string::at(local_28);
      std::__cxx11::string::operator+=(local_88,*pcVar4);
      pcVar4 = (char *)std::__cxx11::string::at(in_R9);
      local_dc = *pcVar4 + -0x21;
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_b0 = local_b0 + 1;
      std::__cxx11::string::operator+=(local_50,'I');
    }
    else {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(long)local_d8);
      if (*pvVar3 == 'D') {
        std::__cxx11::string::operator+=(local_88,'D');
        local_e0 = 0;
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        pcVar4 = (char *)std::__cxx11::string::operator[](in_stack_00000008);
        std::__cxx11::string::operator+=(local_50,*pcVar4);
        local_ac = local_ac + 1;
      }
      else {
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(long)local_d8);
        if (*pvVar3 == 'S') {
          pcVar4 = (char *)std::__cxx11::string::operator[](in_stack_00000008);
          std::__cxx11::string::operator+=(local_50,*pcVar4);
          if ((local_b0 == 0) ||
             ((pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'C' &&
              (pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'T')))) {
LAB_0027f12f:
            pcVar4 = (char *)std::__cxx11::string::at(local_28);
            std::__cxx11::string::operator+=(local_88,*pcVar4);
          }
          else {
            std::__cxx11::string::size();
            pcVar4 = (char *)std::__cxx11::string::at((ulong)local_88);
            if (*pcVar4 == 'G') goto LAB_0027f12f;
            std::__cxx11::string::size();
            pcVar4 = (char *)std::__cxx11::string::at((ulong)local_50);
            if (*pcVar4 != 'G') goto LAB_0027f12f;
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_100,(ulong)local_88);
            std::__cxx11::string::operator=(local_88,local_100);
            std::__cxx11::string::~string(local_100);
            std::__cxx11::string::operator+=(local_88,"G");
            pcVar4 = (char *)std::__cxx11::string::at(local_28);
            std::__cxx11::string::operator+=(local_88,*pcVar4);
            pcVar4 = (char *)std::__cxx11::string::at(local_28);
            std::__cxx11::string::operator+=(local_d0,*pcVar4);
            std::__cxx11::string::replace(local_28,(long)(local_b0 + -1),(string *)0x2);
            std::__cxx11::string::operator=(local_d0,"G");
          }
          pcVar4 = (char *)std::__cxx11::string::at(in_R9);
          local_104 = *pcVar4 + -0x21;
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          local_ac = local_ac + 1;
          local_b0 = local_b0 + 1;
        }
        else {
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(long)local_d8);
          if (*pvVar3 == 'H') {
            std::__cxx11::string::operator+=(local_88,'H');
            pcVar4 = (char *)std::__cxx11::string::at(in_R9);
            local_108 = *pcVar4 + -0x21;
            std::vector<int,_std::allocator<int>_>::push_back
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
            std::__cxx11::string::operator+=(local_50,'H');
            local_b0 = local_b0 + 1;
            local_ac = local_ac + 1;
            goto LAB_0027fbdb;
          }
          pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(long)local_d8);
          if (*pvVar3 != 'M') {
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(long)local_d8);
            if (*pvVar3 != 'N') {
              pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDX,(long)local_d8);
              if (*pvVar3 != 'P') goto LAB_0027fbdb;
              pcVar4 = (char *)std::__cxx11::string::operator[](in_stack_00000008);
              std::__cxx11::string::operator+=(local_50,*pcVar4);
              if ((local_b0 == 0) ||
                 ((pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'C' &&
                  (pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'T')))) {
LAB_0027fb2f:
                pcVar4 = (char *)std::__cxx11::string::at(local_28);
                std::__cxx11::string::operator+=(local_88,*pcVar4);
              }
              else {
                std::__cxx11::string::size();
                pcVar4 = (char *)std::__cxx11::string::at((ulong)local_88);
                if (*pcVar4 == 'G') goto LAB_0027fb2f;
                std::__cxx11::string::size();
                pcVar4 = (char *)std::__cxx11::string::at((ulong)local_50);
                if (*pcVar4 != 'G') goto LAB_0027fb2f;
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)(local_188 + 0x10),(ulong)local_88);
                std::__cxx11::string::operator=(local_88,(string *)(local_188 + 0x10));
                std::__cxx11::string::~string((string *)(local_188 + 0x10));
                std::__cxx11::string::operator+=(local_88,"G");
                pcVar4 = (char *)std::__cxx11::string::at(local_28);
                std::__cxx11::string::operator+=(local_88,*pcVar4);
                pcVar4 = (char *)std::__cxx11::string::at(local_28);
                std::__cxx11::string::operator+=(local_d0,*pcVar4);
                std::__cxx11::string::replace(local_28,(long)(local_b0 + -1),(string *)0x2);
                std::__cxx11::string::operator=(local_d0,"G");
              }
              pcVar4 = (char *)std::__cxx11::string::at(in_R9);
              local_188._12_4_ = *pcVar4 + -0x21;
              std::vector<int,_std::allocator<int>_>::push_back
                        (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
              local_b0 = local_b0 + 1;
              local_ac = local_ac + 1;
              goto LAB_0027fbdb;
            }
            pcVar4 = (char *)std::__cxx11::string::operator[](in_stack_00000008);
            std::__cxx11::string::operator+=(local_50,*pcVar4);
            if ((local_b0 == 0) ||
               ((pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'C' &&
                (pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'T')))) {
LAB_0027f840:
              pcVar4 = (char *)std::__cxx11::string::at(local_28);
              std::__cxx11::string::operator+=(local_88,*pcVar4);
            }
            else {
              std::__cxx11::string::size();
              pcVar4 = (char *)std::__cxx11::string::at((ulong)local_88);
              if (*pcVar4 == 'G') goto LAB_0027f840;
              std::__cxx11::string::size();
              pcVar4 = (char *)std::__cxx11::string::at((ulong)local_50);
              if (*pcVar4 != 'G') goto LAB_0027f840;
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_150,(ulong)local_88);
              std::__cxx11::string::operator=(local_88,local_150);
              std::__cxx11::string::~string(local_150);
              std::__cxx11::string::operator+=(local_88,"G");
              pcVar4 = (char *)std::__cxx11::string::at(local_28);
              std::__cxx11::string::operator+=(local_88,*pcVar4);
              pcVar4 = (char *)std::__cxx11::string::at(local_28);
              std::__cxx11::string::operator+=(local_d0,*pcVar4);
              std::__cxx11::string::replace(local_28,(long)(local_b0 + -1),(string *)0x2);
              std::__cxx11::string::operator=(local_d0,"G");
            }
            pcVar4 = (char *)std::__cxx11::string::at(in_R9);
            local_154 = *pcVar4 + -0x21;
            std::vector<int,_std::allocator<int>_>::push_back
                      (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
            local_b0 = local_b0 + 1;
            local_ac = local_ac + 1;
            goto LAB_0027fbdb;
          }
          pcVar4 = (char *)std::__cxx11::string::operator[](in_stack_00000008);
          std::__cxx11::string::operator+=(local_50,*pcVar4);
          if ((local_b0 == 0) ||
             ((pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'C' &&
              (pcVar4 = (char *)std::__cxx11::string::at(local_28), *pcVar4 != 'T')))) {
LAB_0027f515:
            pcVar4 = (char *)std::__cxx11::string::at(local_28);
            std::__cxx11::string::operator+=(local_88,*pcVar4);
          }
          else {
            std::__cxx11::string::size();
            pcVar4 = (char *)std::__cxx11::string::at((ulong)local_88);
            if (*pcVar4 == 'G') goto LAB_0027f515;
            std::__cxx11::string::size();
            pcVar4 = (char *)std::__cxx11::string::at((ulong)local_50);
            if (*pcVar4 != 'G') goto LAB_0027f515;
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_128,(ulong)local_88);
            std::__cxx11::string::operator=(local_88,local_128);
            std::__cxx11::string::~string(local_128);
            std::__cxx11::string::operator+=(local_88,"G");
            pcVar4 = (char *)std::__cxx11::string::at(local_28);
            std::__cxx11::string::operator+=(local_88,*pcVar4);
            pcVar4 = (char *)std::__cxx11::string::at(local_28);
            std::__cxx11::string::operator+=(local_d0,*pcVar4);
            std::__cxx11::string::replace(local_28,(long)(local_b0 + -1),(string *)0x2);
            std::__cxx11::string::operator=(local_d0,"G");
          }
          pcVar4 = (char *)std::__cxx11::string::at(in_R9);
          local_12c = *pcVar4 + -0x21;
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          local_b0 = local_b0 + 1;
          local_ac = local_ac + 1;
        }
      }
    }
LAB_0027fbdb:
    local_d8 = local_d8 + 1;
  } while( true );
}

Assistant:

std::tuple<string,string,vector<int>> AlignmentRecord::referenceString(const std::vector<char> cigarData, int startPosition, std::string& sequence, string  qualities, string & reference){

    string constructedReference = "";
    string alignSeq="";
    vector<int> qualityList;
    int referenceCounter = startPosition-computeOffset(cigarData);
    int sequenceCounter=0;//this is the quality counter as well
    string replaceString = "G";

    for ( int s = 0; s < cigarData.size(); s++) {
        if (cigarData[s] == 'I') {
            alignSeq+=sequence.at(sequenceCounter);
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            constructedReference +='I';
        }else if (cigarData[s] == 'D'){
            alignSeq+='D';
            qualityList.push_back(0);
            constructedReference += (reference)[referenceCounter];
            referenceCounter++;
        }else if (cigarData[s] == 'S'){
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            referenceCounter++;
            sequenceCounter++;
        }else if (cigarData[s] == 'H'){
            alignSeq+='H';
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            constructedReference += 'H';
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'M') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'N') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else if (cigarData[s] == 'P') {
            constructedReference += (reference)[referenceCounter];
            //Correcting GC position errors in the reads by checking the reference
            if(sequenceCounter!=0 && (sequence.at(sequenceCounter)=='C' || sequence.at(sequenceCounter)=='T') && (alignSeq.at(alignSeq.size()-1)!='G' && constructedReference.at(alignSeq.size()-1)=='G')){
                alignSeq = alignSeq.substr(0,alignSeq.size()-1);
                alignSeq += "G";
                alignSeq += sequence.at(sequenceCounter);
                replaceString += sequence.at(sequenceCounter);
                sequence.replace(sequenceCounter-1,2,replaceString);
                replaceString = "G";
            }else{
                alignSeq+=sequence.at(sequenceCounter);
            }
            qualityList.push_back(qualities.at(sequenceCounter)-33);
            sequenceCounter++;
            referenceCounter++;
        }else {
            assert(false);
        }
    }
    constructedReference+=reference[referenceCounter];


    if(cigarData.size()!=constructedReference.size()-1){
        assert(false);
    }
    boost::algorithm::to_upper(constructedReference);
    boost::algorithm::to_upper(alignSeq);
    return std::make_tuple(constructedReference,alignSeq,qualityList);

}